

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O3

void __thiscall
Equality_namedEntityNotEqualNonNamedEntity_Test::~Equality_namedEntityNotEqualNonNamedEntity_Test
          (Equality_namedEntityNotEqualNonNamedEntity_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Equality, namedEntityNotEqualNonNamedEntity)
{
    libcellml::VariablePtr v1 = libcellml::Variable::create("variableA");
    libcellml::ImportSourcePtr is1 = libcellml::ImportSource::create();
    libcellml::ResetPtr r1 = libcellml::Reset::create();

    EXPECT_FALSE(v1->equals(is1));
    EXPECT_FALSE(is1->equals(v1));

    EXPECT_FALSE(v1->equals(r1));
    EXPECT_FALSE(r1->equals(v1));
}